

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFCommon.cpp
# Opt level: O3

bool glTFCommon::Util::ParseDataURI(char *const_uri,size_t uriLen,DataURI *out)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  char cVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  if (const_uri == (char *)0x0) {
    return false;
  }
  if ((*const_uri == '\x10') || (iVar3 = strncmp(const_uri,"data:",5), iVar3 == 0)) {
    out->mediaType = "text/plain";
    out->charset = "US-ASCII";
    out->base64 = false;
    if (*const_uri != '\x10') {
      *const_uri = '\x10';
      const_uri[1] = '\0';
      const_uri[2] = '\0';
      const_uri[3] = '\0';
      const_uri[4] = '\0';
      cVar8 = const_uri[5];
      uVar7 = 5;
      if ((cVar8 != ',') && (cVar8 != ';')) {
        const_uri[1] = '\x05';
        sVar6 = 5;
        if (5 < uriLen) {
          sVar6 = uriLen;
        }
        while ((cVar8 != ',' && (cVar8 != ';'))) {
          if (sVar6 == uVar7) goto LAB_0063ea53;
          lVar2 = uVar7 + 1;
          uVar7 = uVar7 + 1;
          cVar8 = const_uri[lVar2];
        }
      }
      pcVar5 = const_uri + uVar7;
      bVar11 = uVar7 < uriLen;
      if (bVar11) {
        while (cVar8 == ';') {
          uVar1 = uVar7 + 1;
          *pcVar5 = '\0';
          uVar9 = uVar1;
          uVar4 = uVar1;
          if (uVar1 < uriLen) {
            uVar4 = uriLen;
          }
          for (; ((uVar10 = uVar9, const_uri[uVar9] != ',' && (const_uri[uVar9] != ';')) &&
                 (uVar10 = uVar4, uVar9 < uriLen)); uVar9 = uVar9 + 1) {
          }
          iVar3 = strncmp(const_uri + uVar1,"charset=",8);
          if (iVar3 == 0) {
            const_uri[2] = (char)uVar7 + '\t';
          }
          else {
            iVar3 = strncmp(const_uri + uVar1,"base64",6);
            if (iVar3 == 0) {
              const_uri[3] = (char)uVar1;
            }
          }
          pcVar5 = const_uri + uVar10;
          bVar11 = uVar10 < uriLen;
          uVar7 = uVar10;
          if (!bVar11) break;
          cVar8 = const_uri[uVar10];
        }
      }
      if (bVar11) {
        *pcVar5 = '\0';
        cVar8 = (char)uVar7 + '\x01';
      }
      else {
LAB_0063ea53:
        const_uri[3] = '\0';
        const_uri[1] = '\0';
        const_uri[2] = '\0';
        cVar8 = '\x05';
      }
      const_uri[4] = cVar8;
    }
    if ((long)const_uri[1] != 0) {
      out->mediaType = const_uri + const_uri[1];
    }
    if ((long)const_uri[2] != 0) {
      out->charset = const_uri + const_uri[2];
    }
    if (const_uri[3] != '\0') {
      out->base64 = true;
    }
    cVar8 = const_uri[4];
    out->data = const_uri + cVar8;
    out->dataLength = uriLen - (long)cVar8;
    bVar11 = true;
  }
  else {
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool ParseDataURI(const char* const_uri, size_t uriLen, DataURI& out) {
    if (nullptr == const_uri) {
        return false;
    }

    if (const_uri[0] != 0x10) { // we already parsed this uri?
        if (strncmp(const_uri, "data:", 5) != 0) // not a data uri?
            return false;
    }

    // set defaults
    out.mediaType = "text/plain";
    out.charset = "US-ASCII";
    out.base64 = false;

    char* uri = const_cast<char*>(const_uri);
    if (uri[0] != 0x10) {
        uri[0] = 0x10;
        uri[1] = uri[2] = uri[3] = uri[4] = 0;

        size_t i = 5, j;
        if (uri[i] != ';' && uri[i] != ',') { // has media type?
            uri[1] = char(i);
            for (; uri[i] != ';' && uri[i] != ',' && i < uriLen; ++i) {
                // nothing to do!
            }
        }
        while (uri[i] == ';' && i < uriLen) {
            uri[i++] = '\0';
            for (j = i; uri[i] != ';' && uri[i] != ',' && i < uriLen; ++i) {
                // nothing to do!
            }

            if (strncmp(uri + j, "charset=", 8) == 0) {
                uri[2] = char(j + 8);
            }
            else if (strncmp(uri + j, "base64", 6) == 0) {
                uri[3] = char(j);
            }
        }
        if (i < uriLen) {
            uri[i++] = '\0';
            uri[4] = char(i);
        }
        else {
            uri[1] = uri[2] = uri[3] = 0;
            uri[4] = 5;
        }
    }

    if (uri[1] != 0) {
        out.mediaType = uri + uri[1];
    }
    if (uri[2] != 0) {
        out.charset = uri + uri[2];
    }
    if (uri[3] != 0) {
        out.base64 = true;
    }
    out.data = uri + uri[4];
    out.dataLength = (uri + uriLen) - out.data;

    return true;
}